

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void JS_AddIntrinsicTypedArrays(JSContext *ctx)

{
  JSValueUnion *pJVar1;
  JSValue proto;
  JSValue v;
  JSValue v_00;
  JSValue obj_00;
  JSValue obj_01;
  JSValue obj_02;
  JSValue obj_03;
  JSValue obj_04;
  JSValue func_obj_00;
  JSValue val;
  JSValue val_00;
  JSValue obj_05;
  JSValue proto_00;
  JSValue proto_01;
  JSValue proto_02;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue proto_03;
  JSValue func_obj_01;
  JSValue val_01;
  JSValue this_obj_01;
  JSValue obj_06;
  JSValueUnion JVar2;
  long in_RDI;
  JSValue JVar3;
  JSValue JVar4;
  char *name;
  char buf [64];
  JSValue func_obj;
  JSValue obj;
  int i;
  JSValue shared_array_buffer_func;
  JSValue array_buffer_func;
  JSValue typed_array_base_func;
  JSValue typed_array_base_proto;
  undefined4 uVar5;
  int in_stack_fffffffffffffdac;
  undefined4 in_stack_fffffffffffffdb0;
  int in_stack_fffffffffffffdb4;
  JSValueUnion in_stack_fffffffffffffdb8;
  JSContext *in_stack_fffffffffffffdc0;
  JSContext *ctx_00;
  JSContext *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  JSCFunctionEnum in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  uint8_t *ctx_01;
  undefined4 in_stack_fffffffffffffde8;
  int flags;
  JSAtom prop;
  undefined4 in_stack_fffffffffffffdf8;
  undefined4 uVar6;
  long lVar7;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 uVar8;
  JSValue in_stack_fffffffffffffe10;
  JSValueUnion local_1e0;
  list_head *local_1d8;
  int in_stack_fffffffffffffe30;
  JSValueUnion local_1a0;
  JSValueUnion JStack_198;
  JSValueUnion JVar9;
  JSValueUnion JVar10;
  JSValueUnion JVar11;
  JSValueUnion JVar12;
  JSValueUnion local_d0;
  int64_t iStack_c8;
  int local_bc;
  
  flags = (int)*(undefined8 *)(in_RDI + 0x40);
  prop = (JSAtom)((ulong)*(undefined8 *)(in_RDI + 0x40) >> 0x20);
  JVar3 = JS_NewObject((JSContext *)0x120515);
  local_d0 = JVar3.u;
  iStack_c8 = JVar3.tag;
  *(JSValueUnion *)(CONCAT44(prop,flags) + 0x130) = local_d0;
  *(int64_t *)(CONCAT44(prop,flags) + 0x138) = iStack_c8;
  uVar6 = 3;
  JVar4.tag._0_4_ = in_stack_fffffffffffffdd0;
  JVar4.u.ptr = in_stack_fffffffffffffdc8;
  JVar4.tag._4_4_ = in_stack_fffffffffffffdd4;
  JS_SetPropertyFunctionList
            (in_stack_fffffffffffffdc0,JVar4,(JSCFunctionListEntry *)in_stack_fffffffffffffdb8.ptr,
             in_stack_fffffffffffffdb4);
  uVar8 = 1;
  proto_00.u._4_4_ = in_stack_fffffffffffffdd4;
  proto_00.u.int32 = in_stack_fffffffffffffdd0;
  proto_00.tag._0_4_ = in_stack_fffffffffffffdd8;
  proto_00.tag._4_4_ = in_stack_fffffffffffffddc;
  JVar3 = JS_NewGlobalCConstructorOnly
                    (in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
                     (JSCFunction *)in_stack_fffffffffffffdb8.ptr,in_stack_fffffffffffffdb4,proto_00
                    );
  JVar12 = JVar3.u;
  obj_00.tag._0_4_ = in_stack_fffffffffffffdd0;
  obj_00.u.ptr = in_stack_fffffffffffffdc8;
  obj_00.tag._4_4_ = in_stack_fffffffffffffdd4;
  JS_SetPropertyFunctionList
            (in_stack_fffffffffffffdc0,obj_00,(JSCFunctionListEntry *)in_stack_fffffffffffffdb8.ptr,
             in_stack_fffffffffffffdb4);
  lVar7 = *(long *)(in_RDI + 0x40);
  JVar3 = JS_NewObject((JSContext *)0x120603);
  JVar10 = JVar3.u;
  JVar11 = (JSValueUnion)JVar3.tag;
  *(JSValueUnion *)(lVar7 + 0x140) = JVar10;
  *(JSValueUnion *)(lVar7 + 0x148) = JVar11;
  obj_01.tag._0_4_ = in_stack_fffffffffffffdd0;
  obj_01.u.ptr = in_stack_fffffffffffffdc8;
  obj_01.tag._4_4_ = in_stack_fffffffffffffdd4;
  JS_SetPropertyFunctionList
            (in_stack_fffffffffffffdc0,obj_01,(JSCFunctionListEntry *)in_stack_fffffffffffffdb8.ptr,
             in_stack_fffffffffffffdb4);
  proto_01.u._4_4_ = in_stack_fffffffffffffdd4;
  proto_01.u.int32 = in_stack_fffffffffffffdd0;
  proto_01.tag._0_4_ = in_stack_fffffffffffffdd8;
  proto_01.tag._4_4_ = in_stack_fffffffffffffddc;
  JVar3 = JS_NewGlobalCConstructorOnly
                    (in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0,
                     (JSCFunction *)in_stack_fffffffffffffdb8.ptr,in_stack_fffffffffffffdb4,proto_01
                    );
  JVar2 = JVar3.u;
  JVar9 = (JSValueUnion)JVar3.tag;
  obj_02.tag._0_4_ = in_stack_fffffffffffffdd0;
  obj_02.u.ptr = in_stack_fffffffffffffdc8;
  obj_02.tag._4_4_ = in_stack_fffffffffffffdd4;
  JS_SetPropertyFunctionList
            (in_stack_fffffffffffffdc0,obj_02,(JSCFunctionListEntry *)in_stack_fffffffffffffdb8.ptr,
             in_stack_fffffffffffffdb4);
  JVar3 = JS_NewObject((JSContext *)0x1206dc);
  obj_03.tag._0_4_ = in_stack_fffffffffffffdd0;
  obj_03.u.ptr = in_stack_fffffffffffffdc8;
  obj_03.tag._4_4_ = in_stack_fffffffffffffdd4;
  JS_SetPropertyFunctionList
            (in_stack_fffffffffffffdc0,obj_03,(JSCFunctionListEntry *)in_stack_fffffffffffffdb8.ptr,
             in_stack_fffffffffffffdb4);
  obj_06.tag = (int64_t)JVar12.ptr;
  obj_06.u.float64 = JVar11.float64;
  this_obj_01.tag = (int64_t)JVar10.ptr;
  this_obj_01.u.float64 = JVar9.float64;
  JS_GetPropertyInternal
            ((JSContext *)JVar2.ptr,obj_06,JVar3.tag._4_4_,this_obj_01,
             (BOOL)*(undefined8 *)(*(long *)(in_RDI + 0x40) + 0x20));
  uVar5 = 3;
  val_01.tag._0_4_ = in_stack_fffffffffffffe08;
  val_01.u = (JSValueUnion)lVar7;
  val_01.tag._4_4_ = uVar8;
  JS_DefinePropertyValue
            ((JSContext *)CONCAT44(uVar6,in_stack_fffffffffffffdf8),in_stack_fffffffffffffe10,prop,
             val_01,in_stack_fffffffffffffe30);
  JVar4 = JS_NewCFunction(in_stack_fffffffffffffdc0,(JSCFunction *)in_stack_fffffffffffffdb8.ptr,
                          (char *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                          in_stack_fffffffffffffdac);
  obj_04.tag._0_4_ = in_stack_fffffffffffffdd0;
  obj_04.u.ptr = in_stack_fffffffffffffdc8;
  obj_04.tag._4_4_ = in_stack_fffffffffffffdd4;
  JS_SetPropertyFunctionList
            (in_stack_fffffffffffffdc0,obj_04,(JSCFunctionListEntry *)in_stack_fffffffffffffdb8.ptr,
             in_stack_fffffffffffffdb4);
  func_obj_00.tag._0_4_ = in_stack_fffffffffffffdd0;
  func_obj_00.u.ptr = in_stack_fffffffffffffdc8;
  func_obj_00.tag._4_4_ = in_stack_fffffffffffffdd4;
  JVar3.tag = (int64_t)in_stack_fffffffffffffdc0;
  JVar3.u.ptr = in_stack_fffffffffffffdb8.ptr;
  JS_SetConstructor((JSContext *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                    func_obj_00,JVar3);
  for (local_bc = 0x15; local_bc < 0x1e; local_bc = local_bc + 1) {
    in_stack_fffffffffffffdd0 = (undefined4)*(undefined8 *)(in_RDI + 0x40);
    in_stack_fffffffffffffdd4 = (int)((ulong)*(undefined8 *)(in_RDI + 0x40) >> 0x20);
    in_stack_fffffffffffffdc8 = (JSContext *)((long)local_bc << 4);
    proto.u._4_4_ = in_stack_fffffffffffffdac;
    proto.u.int32 = uVar5;
    proto.tag._0_4_ = in_stack_fffffffffffffdb0;
    proto.tag._4_4_ = in_stack_fffffffffffffdb4;
    JVar3 = JS_NewObjectProto((JSContext *)0x1208ed,proto);
    local_1a0 = JVar3.u;
    JStack_198 = (JSValueUnion)JVar3.tag;
    pJVar1 = (JSValueUnion *)
             ((long)&(in_stack_fffffffffffffdc8->header).ref_count +
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    *pJVar1 = local_1a0;
    pJVar1[1] = JStack_198;
    JVar2.ptr = (void *)((long)local_bc << 4);
    in_stack_fffffffffffffdd8 = JVar2.int32;
    in_stack_fffffffffffffddc = JVar2._4_4_;
    ctx_01 = "";
    uVar8 = 1;
    uVar5 = 0;
    this_obj.tag = (int64_t)"";
    this_obj.u = (JSValueUnion)(JSValueUnion)JVar2.ptr;
    val.tag._0_4_ = in_stack_fffffffffffffdd0;
    val.u.ptr = in_stack_fffffffffffffdc8;
    val.tag._4_4_ = in_stack_fffffffffffffdd4;
    JS_DefinePropertyValueStr
              (in_stack_fffffffffffffdc0,this_obj,(char *)in_stack_fffffffffffffdb8.ptr,val,flags);
    JS_AtomGetStr((JSContext *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                  (char *)CONCAT44(in_stack_fffffffffffffdac,uVar5),0,0x1209f8);
    in_stack_fffffffffffffdac = JVar4.u._4_4_;
    in_stack_fffffffffffffdb0 = (undefined4)JVar4.tag;
    in_stack_fffffffffffffdb4 = JVar4.tag._4_4_;
    JS_NewCFunction3((JSContext *)CONCAT44(prop,flags),
                     (JSCFunction *)CONCAT44(uVar8,in_stack_fffffffffffffde8),(char *)ctx_01,
                     in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd4,
                     in_stack_fffffffffffffe10);
    func_obj_01.u._4_4_ = uVar6;
    func_obj_01.u.int32 = in_stack_fffffffffffffdf8;
    func_obj_01.tag = lVar7;
    proto_03.u._4_4_ = uVar8;
    proto_03.u.int32 = in_stack_fffffffffffffde8;
    proto_03.tag._0_4_ = flags;
    proto_03.tag._4_4_ = prop;
    JS_NewGlobalCConstructor2
              ((JSContext *)ctx_01,func_obj_01,
               (char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),proto_03);
    uVar5 = 0;
    this_obj_00.u._4_4_ = in_stack_fffffffffffffddc;
    this_obj_00.u.int32 = in_stack_fffffffffffffdd8;
    this_obj_00.tag = (int64_t)ctx_01;
    val_00.tag._0_4_ = in_stack_fffffffffffffdd0;
    val_00.u.ptr = in_stack_fffffffffffffdc8;
    val_00.tag._4_4_ = in_stack_fffffffffffffdd4;
    JS_DefinePropertyValueStr
              (in_stack_fffffffffffffdc0,this_obj_00,(char *)in_stack_fffffffffffffdb8.ptr,val_00,
               flags);
  }
  v.tag = (int64_t)in_stack_fffffffffffffdc0;
  v.u.float64 = in_stack_fffffffffffffdb8.float64;
  JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),v);
  v_00.tag = (int64_t)in_stack_fffffffffffffdc0;
  v_00.u.ptr = in_stack_fffffffffffffdb8.ptr;
  JS_FreeValue((JSContext *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),v_00);
  ctx_00 = *(JSContext **)(in_RDI + 0x40);
  JVar3 = JS_NewObject((JSContext *)0x120ba8);
  local_1e0 = JVar3.u;
  ctx_00[1].link.prev = (list_head *)local_1e0;
  local_1d8 = (list_head *)JVar3.tag;
  ctx_00[1].link.next = local_1d8;
  obj_05.tag._0_4_ = in_stack_fffffffffffffdd0;
  obj_05.u.ptr = in_stack_fffffffffffffdc8;
  obj_05.tag._4_4_ = in_stack_fffffffffffffdd4;
  JS_SetPropertyFunctionList
            (ctx_00,obj_05,(JSCFunctionListEntry *)in_stack_fffffffffffffdb8.ptr,
             in_stack_fffffffffffffdb4);
  proto_02.u._4_4_ = in_stack_fffffffffffffdd4;
  proto_02.u.int32 = in_stack_fffffffffffffdd0;
  proto_02.tag._0_4_ = in_stack_fffffffffffffdd8;
  proto_02.tag._4_4_ = in_stack_fffffffffffffddc;
  JS_NewGlobalCConstructorOnly
            (in_stack_fffffffffffffdc8,(char *)ctx_00,(JSCFunction *)in_stack_fffffffffffffdb8.ptr,
             in_stack_fffffffffffffdb4,proto_02);
  JS_AddIntrinsicAtomics((JSContext *)0x120c5d);
  return;
}

Assistant:

void JS_AddIntrinsicTypedArrays(JSContext *ctx)
{
    JSValue typed_array_base_proto, typed_array_base_func;
    JSValueConst array_buffer_func, shared_array_buffer_func;
    int i;

    ctx->class_proto[JS_CLASS_ARRAY_BUFFER] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_ARRAY_BUFFER],
                               js_array_buffer_proto_funcs,
                               countof(js_array_buffer_proto_funcs));

    array_buffer_func = JS_NewGlobalCConstructorOnly(ctx, "ArrayBuffer",
                                                 js_array_buffer_constructor, 1,
                                                 ctx->class_proto[JS_CLASS_ARRAY_BUFFER]);
    JS_SetPropertyFunctionList(ctx, array_buffer_func,
                               js_array_buffer_funcs,
                               countof(js_array_buffer_funcs));

    ctx->class_proto[JS_CLASS_SHARED_ARRAY_BUFFER] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_SHARED_ARRAY_BUFFER],
                               js_shared_array_buffer_proto_funcs,
                               countof(js_shared_array_buffer_proto_funcs));

    shared_array_buffer_func = JS_NewGlobalCConstructorOnly(ctx, "SharedArrayBuffer",
                                                 js_shared_array_buffer_constructor, 1,
                                                 ctx->class_proto[JS_CLASS_SHARED_ARRAY_BUFFER]);
    JS_SetPropertyFunctionList(ctx, shared_array_buffer_func,
                               js_shared_array_buffer_funcs,
                               countof(js_shared_array_buffer_funcs));

    typed_array_base_proto = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, typed_array_base_proto,
                               js_typed_array_base_proto_funcs,
                               countof(js_typed_array_base_proto_funcs));

    /* TypedArray.prototype.toString must be the same object as Array.prototype.toString */
    JSValue obj = JS_GetProperty(ctx, ctx->class_proto[JS_CLASS_ARRAY], JS_ATOM_toString);
    /* XXX: should use alias method in JSCFunctionListEntry */ //@@@
    JS_DefinePropertyValue(ctx, typed_array_base_proto, JS_ATOM_toString, obj,
                           JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);

    typed_array_base_func = JS_NewCFunction(ctx, js_typed_array_base_constructor,
                                            "TypedArray", 0);
    JS_SetPropertyFunctionList(ctx, typed_array_base_func,
                               js_typed_array_base_funcs,
                               countof(js_typed_array_base_funcs));
    JS_SetConstructor(ctx, typed_array_base_func, typed_array_base_proto);

    for(i = JS_CLASS_UINT8C_ARRAY; i < JS_CLASS_UINT8C_ARRAY + JS_TYPED_ARRAY_COUNT; i++) {
        JSValue func_obj;
        char buf[ATOM_GET_STR_BUF_SIZE];
        const char *name;

        ctx->class_proto[i] = JS_NewObjectProto(ctx, typed_array_base_proto);
        JS_DefinePropertyValueStr(ctx, ctx->class_proto[i],
                                  "BYTES_PER_ELEMENT",
                                  JS_NewInt32(ctx, 1 << typed_array_size_log2(i)),
                                  0);
        name = JS_AtomGetStr(ctx, buf, sizeof(buf),
                             JS_ATOM_Uint8ClampedArray + i - JS_CLASS_UINT8C_ARRAY);
        func_obj = JS_NewCFunction3(ctx, (JSCFunction *)js_typed_array_constructor,
                                    name, 3, JS_CFUNC_constructor_magic, i,
                                    typed_array_base_func);
        JS_NewGlobalCConstructor2(ctx, func_obj, name, ctx->class_proto[i]);
        JS_DefinePropertyValueStr(ctx, func_obj,
                                  "BYTES_PER_ELEMENT",
                                  JS_NewInt32(ctx, 1 << typed_array_size_log2(i)),
                                  0);
    }
    JS_FreeValue(ctx, typed_array_base_proto);
    JS_FreeValue(ctx, typed_array_base_func);

    /* DataView */
    ctx->class_proto[JS_CLASS_DATAVIEW] = JS_NewObject(ctx);
    JS_SetPropertyFunctionList(ctx, ctx->class_proto[JS_CLASS_DATAVIEW],
                               js_dataview_proto_funcs,
                               countof(js_dataview_proto_funcs));
    JS_NewGlobalCConstructorOnly(ctx, "DataView",
                                 js_dataview_constructor, 1,
                                 ctx->class_proto[JS_CLASS_DATAVIEW]);
    /* Atomics */
#ifdef CONFIG_ATOMICS
    JS_AddIntrinsicAtomics(ctx);
#endif
}